

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O3

bool __thiscall
google::protobuf::compiler::Parser::ParseMessageFieldNoLabel
          (Parser *this,FieldDescriptorProto *field,
          RepeatedPtrField<google::protobuf::DescriptorProto> *messages,
          LocationRecorder *parent_location,int location_field_number_for_nested_type,
          LocationRecorder *field_location,FileDescriptorProto *containing_file)

{
  byte *pbVar1;
  ArenaStringPtr *this_00;
  byte bVar2;
  Tokenizer *pTVar3;
  pointer pcVar4;
  ErrorCollector *pEVar5;
  size_type sVar6;
  ulong uVar7;
  undefined4 uVar8;
  bool bVar9;
  bool bVar10;
  int iVar11;
  uint uVar12;
  Type *this_01;
  string *psVar13;
  size_type sVar14;
  LocationRecorder *this_02;
  LocationRecorder location;
  Type type;
  Token name_token;
  MapField map_field;
  LocationRecorder local_100;
  undefined1 local_f0 [16];
  undefined1 local_e0 [32];
  undefined1 local_c0 [8];
  undefined1 local_b8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_98;
  undefined1 local_88 [12];
  Type local_7c;
  Type local_78 [2];
  string local_70;
  string local_50;
  
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  local_88[8] = '\0';
  local_70._M_string_length = 0;
  local_70.field_2._M_local_buf[0] = '\0';
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  local_50._M_string_length = 0;
  local_50.field_2._M_local_buf[0] = '\0';
  local_e0._16_4_ = location_field_number_for_nested_type;
  local_e0._24_8_ = messages;
  local_88._0_8_ = parent_location;
  LocationRecorder::LocationRecorder((LocationRecorder *)local_e0,field_location);
  LocationRecorder::RecordLegacyLocation((LocationRecorder *)local_e0,&field->super_Message,TYPE);
  local_e0._20_4_ = 5;
  pcVar4 = local_b8 + 8;
  local_b8._0_8_ =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        *)0x0;
  local_b8[8] = '\0';
  local_c0 = (undefined1  [8])pcVar4;
  bVar9 = TryConsume(this,"map");
  if (bVar9) {
    iVar11 = std::__cxx11::string::compare((char *)&(this->input_->current_).text);
    if (iVar11 == 0) {
      local_88[8] = '\x01';
      goto LAB_002ce9c0;
    }
    bVar9 = true;
    std::__cxx11::string::_M_replace((ulong)local_c0,0,(char *)local_b8._0_8_,0x3825f1);
  }
  else {
LAB_002ce9c0:
    bVar9 = false;
  }
  uVar12 = (field->_has_bits_).has_bits_[0];
  if (local_88[8] == '\x01') {
    if ((char)uVar12 < '\0') {
      local_100.parser_ = (Parser *)local_f0;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_100,"Map fields are not allowed in oneofs.","");
      pEVar5 = this->error_collector_;
      if (pEVar5 != (ErrorCollector *)0x0) {
        (*pEVar5->_vptr_ErrorCollector[2])
                  (pEVar5,(ulong)(uint)(this->input_->current_).line,
                   (ulong)(uint)(this->input_->current_).column,&local_100);
      }
    }
    else if ((uVar12 >> 8 & 1) == 0) {
      if ((uVar12 & 2) == 0) {
        bVar9 = FieldDescriptorProto_Label_IsValid(3);
        if (!bVar9) goto LAB_002cf1b7;
        pbVar1 = (byte *)((long)(field->_has_bits_).has_bits_ + 1);
        *pbVar1 = *pbVar1 | 1;
        field->label_ = 3;
        bVar9 = Consume(this,"<");
        if ((((bVar9) && (bVar9 = ParseType(this,&local_7c,&local_70), bVar9)) &&
            (bVar9 = Consume(this,","), bVar9)) &&
           ((bVar9 = ParseType(this,local_78,&local_50), bVar9 && (bVar9 = Consume(this,">"), bVar9)
            ))) {
          LocationRecorder::AddPath((LocationRecorder *)local_e0,6);
          goto LAB_002ceca2;
        }
        goto LAB_002cf0a2;
      }
      local_100.parser_ = (Parser *)local_f0;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_100,"Map fields are not allowed to be extensions.","");
      pEVar5 = this->error_collector_;
      if (pEVar5 != (ErrorCollector *)0x0) {
        (*pEVar5->_vptr_ErrorCollector[2])
                  (pEVar5,(ulong)(uint)(this->input_->current_).line,
                   (ulong)(uint)(this->input_->current_).column,&local_100);
      }
    }
    else {
      local_100.parser_ = (Parser *)local_f0;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_100,
                 "Field labels (required/optional/repeated) are not allowed on map fields.","");
      pEVar5 = this->error_collector_;
      if (pEVar5 != (ErrorCollector *)0x0) {
        (*pEVar5->_vptr_ErrorCollector[2])
                  (pEVar5,(ulong)(uint)(this->input_->current_).line,
                   (ulong)(uint)(this->input_->current_).column,&local_100);
      }
    }
    this->had_errors_ = true;
    if (local_100.parser_ != (Parser *)local_f0) {
      operator_delete(local_100.parser_,(ulong)((long)&((Token *)local_f0._0_8_)->type + 1));
    }
  }
  else {
    if ((uVar12 >> 8 & 1) == 0) {
      iVar11 = std::__cxx11::string::compare((char *)&this->syntax_identifier_);
      if (iVar11 == 0) {
        bVar10 = FieldDescriptorProto_Label_IsValid(1);
        if (!bVar10) goto LAB_002cf1b7;
        uVar12 = (field->_has_bits_).has_bits_[0] | 0x100;
        (field->_has_bits_).has_bits_[0] = uVar12;
        field->label_ = 1;
      }
      else {
        uVar12 = (field->_has_bits_).has_bits_[0];
      }
    }
    if ((uVar12 >> 8 & 1) == 0) {
      local_100.parser_ = (Parser *)local_f0;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_100,"Expected \"required\", \"optional\", or \"repeated\".","");
      pEVar5 = this->error_collector_;
      if (pEVar5 != (ErrorCollector *)0x0) {
        (*pEVar5->_vptr_ErrorCollector[2])
                  (pEVar5,(ulong)(uint)(this->input_->current_).line,
                   (ulong)(uint)(this->input_->current_).column,&local_100);
      }
      this->had_errors_ = true;
      if (local_100.parser_ != (Parser *)local_f0) {
        operator_delete(local_100.parser_,(ulong)((long)&((Token *)local_f0._0_8_)->type + 1));
      }
      bVar10 = FieldDescriptorProto_Label_IsValid(1);
      if (!bVar10) {
LAB_002cf1b7:
        __assert_fail("::google::protobuf::FieldDescriptorProto_Label_IsValid(value)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/deps/protobuf/src/google/protobuf/descriptor.pb.h"
                      ,0x1487,
                      "void google::protobuf::FieldDescriptorProto::set_label(::google::protobuf::FieldDescriptorProto_Label)"
                     );
      }
      pbVar1 = (byte *)((long)(field->_has_bits_).has_bits_ + 1);
      *pbVar1 = *pbVar1 | 1;
      field->label_ = 1;
    }
    if ((bVar9) || (bVar9 = ParseType(this,(Type *)(local_e0 + 0x14),(string *)local_c0), bVar9)) {
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8._0_8_ ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        LocationRecorder::AddPath((LocationRecorder *)local_e0,5);
        uVar8 = local_e0._20_4_;
        bVar9 = FieldDescriptorProto_Type_IsValid(local_e0._20_4_);
        if (!bVar9) {
          __assert_fail("::google::protobuf::FieldDescriptorProto_Type_IsValid(value)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/deps/protobuf/src/google/protobuf/descriptor.pb.h"
                        ,0x14a0,
                        "void google::protobuf::FieldDescriptorProto::set_type(::google::protobuf::FieldDescriptorProto_Type)"
                       );
        }
        pbVar1 = (byte *)((long)(field->_has_bits_).has_bits_ + 1);
        *pbVar1 = *pbVar1 | 2;
        field->type_ = uVar8;
      }
      else {
        LocationRecorder::AddPath((LocationRecorder *)local_e0,6);
        *(byte *)(field->_has_bits_).has_bits_ = (byte)(field->_has_bits_).has_bits_[0] | 4;
        psVar13 = (field->type_name_).ptr_;
        if (psVar13 == (string *)&internal::fixed_address_empty_string_abi_cxx11_) {
          internal::ArenaStringPtr::CreateInstanceNoArena(&field->type_name_,(string *)local_c0);
        }
        else {
          std::__cxx11::string::_M_assign((string *)psVar13);
        }
      }
LAB_002ceca2:
      if (local_c0 != (undefined1  [8])pcVar4) {
        operator_delete((void *)local_c0,CONCAT71(local_b8._9_7_,local_b8[8]) + 1);
      }
      LocationRecorder::~LocationRecorder((LocationRecorder *)local_e0);
      pTVar3 = this->input_;
      local_c0._0_4_ = (pTVar3->current_).type;
      local_b8._0_8_ = &local_a8;
      pcVar4 = (pTVar3->current_).text._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_b8,pcVar4,pcVar4 + (pTVar3->current_).text._M_string_length);
      local_98._8_4_ = (pTVar3->current_).end_column;
      local_98._M_allocated_capacity._0_4_ = (pTVar3->current_).line;
      local_98._4_4_ = (pTVar3->current_).column;
      LocationRecorder::LocationRecorder(&local_100,field_location,1);
      LocationRecorder::RecordLegacyLocation(&local_100,&field->super_Message,NAME);
      *(byte *)(field->_has_bits_).has_bits_ = (byte)(field->_has_bits_).has_bits_[0] | 1;
      this_00 = &field->name_;
      psVar13 = (field->name_).ptr_;
      if (psVar13 == (string *)&internal::fixed_address_empty_string_abi_cxx11_) {
        internal::ArenaStringPtr::CreateInstanceNoArena
                  (this_00,(string *)&internal::fixed_address_empty_string_abi_cxx11_);
        psVar13 = this_00->ptr_;
      }
      bVar9 = ConsumeIdentifier(this,psVar13,"Expected field name.");
      LocationRecorder::~LocationRecorder(&local_100);
      if ((bVar9) && (bVar9 = Consume(this,"=","Missing field number."), bVar9)) {
        LocationRecorder::LocationRecorder(&local_100,field_location,3);
        LocationRecorder::RecordLegacyLocation(&local_100,&field->super_Message,NUMBER);
        bVar9 = ConsumeInteger(this,(int *)local_e0,"Expected field number.");
        if (!bVar9) {
          this_02 = &local_100;
LAB_002cf0cc:
          LocationRecorder::~LocationRecorder(this_02);
          goto LAB_002cf0d1;
        }
        (field->_has_bits_).has_bits_[0] = (field->_has_bits_).has_bits_[0] | 0x40;
        field->number_ = local_e0._0_4_;
        LocationRecorder::~LocationRecorder(&local_100);
        bVar9 = ParseFieldOptions(this,field,field_location,containing_file);
        if (!bVar9) goto LAB_002cf0d1;
        if ((((field->_has_bits_).has_bits_[0] & 0x200) == 0) || (field->type_ != 10)) {
          bVar9 = ConsumeEndOfDeclaration(this,";",field_location);
        }
        else {
          LocationRecorder::LocationRecorder
                    ((LocationRecorder *)local_e0,(LocationRecorder *)local_88._0_8_);
          LocationRecorder::StartAt((LocationRecorder *)local_e0,field_location);
          LocationRecorder::AddPath((LocationRecorder *)local_e0,local_e0._16_4_);
          LocationRecorder::AddPath((LocationRecorder *)local_e0,*(int *)(local_e0._24_8_ + 8));
          this_01 = internal::RepeatedPtrFieldBase::
                    Add<google::protobuf::RepeatedPtrField<google::protobuf::DescriptorProto>::TypeHandler>
                              ((RepeatedPtrFieldBase *)local_e0._24_8_,(Type *)0x0);
          DescriptorProto::set_name(this_01,this_00->ptr_);
          LocationRecorder::LocationRecorder(&local_100,(LocationRecorder *)local_e0,1);
          LocationRecorder::StartAt(&local_100,(Token *)local_c0);
          LocationRecorder::EndAt(&local_100,(Token *)local_c0);
          LocationRecorder::RecordLegacyLocation(&local_100,&this_01->super_Message,NAME);
          LocationRecorder::~LocationRecorder(&local_100);
          LocationRecorder::LocationRecorder(&local_100,field_location,6);
          LocationRecorder::StartAt(&local_100,(Token *)local_c0);
          LocationRecorder::EndAt(&local_100,(Token *)local_c0);
          LocationRecorder::~LocationRecorder(&local_100);
          if ((byte)(*(((this_01->name_).ptr_)->_M_dataplus)._M_p + 0xa5U) < 0xe6) {
            local_e0._16_4_ = local_98._M_allocated_capacity._0_4_;
            uVar7 = local_98._M_allocated_capacity >> 0x20;
            local_100.parser_ = (Parser *)local_f0;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_100,"Group names must start with a capital letter.","");
            pEVar5 = this->error_collector_;
            if (pEVar5 != (ErrorCollector *)0x0) {
              (*pEVar5->_vptr_ErrorCollector[2])
                        (pEVar5,(ulong)(uint)local_e0._16_4_,uVar7,&local_100);
            }
            this->had_errors_ = true;
            if (local_100.parser_ != (Parser *)local_f0) {
              operator_delete(local_100.parser_,(ulong)((long)&((Token *)local_f0._0_8_)->type + 1))
              ;
            }
          }
          *(byte *)(field->_has_bits_).has_bits_ = (byte)(field->_has_bits_).has_bits_[0] | 1;
          psVar13 = (field->name_).ptr_;
          if (psVar13 == (string *)&internal::fixed_address_empty_string_abi_cxx11_) {
            internal::ArenaStringPtr::CreateInstanceNoArena
                      (this_00,(string *)&internal::fixed_address_empty_string_abi_cxx11_);
            psVar13 = this_00->ptr_;
          }
          sVar6 = psVar13->_M_string_length;
          if (sVar6 != 0) {
            pcVar4 = (psVar13->_M_dataplus)._M_p;
            sVar14 = 0;
            do {
              bVar2 = pcVar4[sVar14];
              if ((byte)(bVar2 + 0xbf) < 0x1a) {
                pcVar4[sVar14] = bVar2 | 0x20;
              }
              sVar14 = sVar14 + 1;
            } while (sVar6 != sVar14);
          }
          FieldDescriptorProto::set_type_name(field,(this_01->name_).ptr_);
          iVar11 = std::__cxx11::string::compare((char *)&(this->input_->current_).text);
          if (iVar11 != 0) {
            local_100.parser_ = (Parser *)local_f0;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_100,"Missing group body.","");
            pEVar5 = this->error_collector_;
            if (pEVar5 != (ErrorCollector *)0x0) {
              (*pEVar5->_vptr_ErrorCollector[2])
                        (pEVar5,(ulong)(uint)(this->input_->current_).line,
                         (ulong)(uint)(this->input_->current_).column,&local_100);
            }
            this->had_errors_ = true;
            if (local_100.parser_ != (Parser *)local_f0) {
              operator_delete(local_100.parser_,(ulong)((long)&((Token *)local_f0._0_8_)->type + 1))
              ;
            }
            this_02 = (LocationRecorder *)local_e0;
            goto LAB_002cf0cc;
          }
          bVar9 = ParseMessageBlock(this,this_01,(LocationRecorder *)local_e0,containing_file);
          this = (Parser *)local_e0;
          LocationRecorder::~LocationRecorder((LocationRecorder *)this);
        }
        if (!bVar9) goto LAB_002cf0d1;
        bVar9 = true;
        if (local_88[8] == '\x01') {
          GenerateMapEntry(this,(MapField *)(local_88 + 8),field,
                           (RepeatedPtrField<google::protobuf::DescriptorProto> *)local_e0._24_8_);
        }
      }
      else {
LAB_002cf0d1:
        bVar9 = false;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8._0_8_ != &local_a8) {
        operator_delete((void *)local_b8._0_8_,(ulong)(local_a8._0_8_ + 1));
      }
      goto LAB_002cf0ef;
    }
  }
LAB_002cf0a2:
  if (local_c0 != (undefined1  [8])pcVar4) {
    operator_delete((void *)local_c0,CONCAT71(local_b8._9_7_,local_b8[8]) + 1);
  }
  LocationRecorder::~LocationRecorder((LocationRecorder *)local_e0);
  bVar9 = false;
LAB_002cf0ef:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,
                    CONCAT71(local_50.field_2._M_allocated_capacity._1_7_,
                             local_50.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,
                    CONCAT71(local_70.field_2._M_allocated_capacity._1_7_,
                             local_70.field_2._M_local_buf[0]) + 1);
  }
  return bVar9;
}

Assistant:

bool Parser::ParseMessageFieldNoLabel(
    FieldDescriptorProto* field,
    RepeatedPtrField<DescriptorProto>* messages,
    const LocationRecorder& parent_location,
    int location_field_number_for_nested_type,
    const LocationRecorder& field_location,
    const FileDescriptorProto* containing_file) {
  MapField map_field;
  // Parse type.
  {
    LocationRecorder location(field_location);  // add path later
    location.RecordLegacyLocation(field, DescriptorPool::ErrorCollector::TYPE);

    bool type_parsed = false;
    FieldDescriptorProto::Type type = FieldDescriptorProto::TYPE_INT32;
    string type_name;

    // Special case map field. We only treat the field as a map field if the
    // field type name starts with the word "map" with a following "<".
    if (TryConsume("map")) {
      if (LookingAt("<")) {
        map_field.is_map_field = true;
      } else {
        // False positive
        type_parsed = true;
        type_name = "map";
      }
    }
    if (map_field.is_map_field) {
      if (field->has_oneof_index()) {
        AddError("Map fields are not allowed in oneofs.");
        return false;
      }
      if (field->has_label()) {
        AddError(
            "Field labels (required/optional/repeated) are not allowed on "
            "map fields.");
        return false;
      }
      if (field->has_extendee()) {
        AddError("Map fields are not allowed to be extensions.");
        return false;
      }
      field->set_label(FieldDescriptorProto::LABEL_REPEATED);
      DO(Consume("<"));
      DO(ParseType(&map_field.key_type, &map_field.key_type_name));
      DO(Consume(","));
      DO(ParseType(&map_field.value_type, &map_field.value_type_name));
      DO(Consume(">"));
      // Defer setting of the type name of the map field until the
      // field name is parsed. Add the source location though.
      location.AddPath(FieldDescriptorProto::kTypeNameFieldNumber);
    } else {
      // Handle the case where no explicit label is given for a non-map field.
      if (!field->has_label() && DefaultToOptionalFields()) {
        field->set_label(FieldDescriptorProto::LABEL_OPTIONAL);
      }
      if (!field->has_label()) {
        AddError("Expected \"required\", \"optional\", or \"repeated\".");
        // We can actually reasonably recover here by just assuming the user
        // forgot the label altogether.
        field->set_label(FieldDescriptorProto::LABEL_OPTIONAL);
      }

      // Handle the case where the actual type is a message or enum named "map",
      // which we already consumed in the code above.
      if (!type_parsed) {
        DO(ParseType(&type, &type_name));
      }
      if (type_name.empty()) {
        location.AddPath(FieldDescriptorProto::kTypeFieldNumber);
        field->set_type(type);
      } else {
        location.AddPath(FieldDescriptorProto::kTypeNameFieldNumber);
        field->set_type_name(type_name);
      }
    }
  }

  // Parse name and '='.
  io::Tokenizer::Token name_token = input_->current();
  {
    LocationRecorder location(field_location,
                              FieldDescriptorProto::kNameFieldNumber);
    location.RecordLegacyLocation(field, DescriptorPool::ErrorCollector::NAME);
    DO(ConsumeIdentifier(field->mutable_name(), "Expected field name."));
  }
  DO(Consume("=", "Missing field number."));

  // Parse field number.
  {
    LocationRecorder location(field_location,
                              FieldDescriptorProto::kNumberFieldNumber);
    location.RecordLegacyLocation(
        field, DescriptorPool::ErrorCollector::NUMBER);
    int number;
    DO(ConsumeInteger(&number, "Expected field number."));
    field->set_number(number);
  }

  // Parse options.
  DO(ParseFieldOptions(field, field_location, containing_file));

  // Deal with groups.
  if (field->has_type() && field->type() == FieldDescriptorProto::TYPE_GROUP) {
    // Awkward:  Since a group declares both a message type and a field, we
    //   have to create overlapping locations.
    LocationRecorder group_location(parent_location);
    group_location.StartAt(field_location);
    group_location.AddPath(location_field_number_for_nested_type);
    group_location.AddPath(messages->size());

    DescriptorProto* group = messages->Add();
    group->set_name(field->name());

    // Record name location to match the field name's location.
    {
      LocationRecorder location(group_location,
                                DescriptorProto::kNameFieldNumber);
      location.StartAt(name_token);
      location.EndAt(name_token);
      location.RecordLegacyLocation(
          group, DescriptorPool::ErrorCollector::NAME);
    }

    // The field's type_name also comes from the name.  Confusing!
    {
      LocationRecorder location(field_location,
                                FieldDescriptorProto::kTypeNameFieldNumber);
      location.StartAt(name_token);
      location.EndAt(name_token);
    }

    // As a hack for backwards-compatibility, we force the group name to start
    // with a capital letter and lower-case the field name.  New code should
    // not use groups; it should use nested messages.
    if (group->name()[0] < 'A' || 'Z' < group->name()[0]) {
      AddError(name_token.line, name_token.column,
        "Group names must start with a capital letter.");
    }
    LowerString(field->mutable_name());

    field->set_type_name(group->name());
    if (LookingAt("{")) {
      DO(ParseMessageBlock(group, group_location, containing_file));
    } else {
      AddError("Missing group body.");
      return false;
    }
  } else {
    DO(ConsumeEndOfDeclaration(";", &field_location));
  }

  // Create a map entry type if this is a map field.
  if (map_field.is_map_field) {
    GenerateMapEntry(map_field, field, messages);
  }

  return true;
}